

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::genTexel
               (Random *rng,deUint32 glFormat,int texelBlockSize,int texelCount,deUint8 *buffer)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  CompressedTexFormat format_00;
  deUint32 dVar10;
  uint uVar11;
  ulong uVar12;
  int x;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  TextureFormatInfo info;
  Vec4 local_78;
  TextureFormat format;
  PixelBufferAccess access;
  
  bVar9 = isFloatFormat(glFormat);
  if (bVar9) {
    format = glu::mapGLInternalFormat(glFormat);
    tcu::PixelBufferAccess::PixelBufferAccess(&access,&format,texelCount,1,1,buffer);
    tcu::getTextureFormatInfo(&info,&format);
    x = 0;
    if (texelCount < 1) {
      texelCount = x;
    }
    for (; fVar6 = info.valueMax.m_data[0], fVar2 = info.valueMin.m_data[0], texelCount != x;
        x = x + 1) {
      fVar14 = deRandom_getFloat(&rng->m_rnd);
      fVar7 = info.valueMax.m_data[1];
      fVar3 = info.valueMin.m_data[1];
      fVar15 = deRandom_getFloat(&rng->m_rnd);
      fVar8 = info.valueMax.m_data[2];
      fVar4 = info.valueMin.m_data[2];
      fVar16 = deRandom_getFloat(&rng->m_rnd);
      fVar5 = info.valueMin.m_data[3];
      fVar18 = info.valueMax.m_data[3] - info.valueMin.m_data[3];
      fVar17 = deRandom_getFloat(&rng->m_rnd);
      local_78.m_data[0] = fVar14 * (fVar6 - fVar2) + fVar2;
      local_78.m_data[1] = fVar15 * (fVar7 - fVar3) + fVar3;
      local_78.m_data[2] = fVar16 * (fVar8 - fVar4) + fVar4;
      local_78.m_data[3] = fVar17 * fVar18 + fVar5;
      tcu::PixelBufferAccess::setPixel(&access,&local_78,x,0,0);
    }
  }
  else {
    bVar9 = glu::isCompressedFormat(glFormat);
    if (bVar9) {
      format_00 = glu::mapGLCompressedTexFormat(glFormat);
      bVar9 = tcu::isAstcFormat(format_00);
      if (bVar9) {
        uVar13 = 0;
        uVar12 = (ulong)(uint)texelCount;
        if (texelCount < 1) {
          uVar12 = uVar13;
        }
        for (; uVar12 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
          dVar10 = deRandom_getUint32(&rng->m_rnd);
          uVar11 = (dVar10 & 7) << 4;
          uVar1 = *(undefined8 *)(&UNK_018df9e8 + uVar11);
          *(undefined8 *)(buffer + (int)uVar13) = *(undefined8 *)(&DAT_018df9e0 + uVar11);
          *(undefined8 *)(buffer + (int)uVar13 + 8) = uVar1;
        }
      }
      else {
        uVar13 = 0;
        uVar12 = (ulong)(uint)(texelCount * texelBlockSize);
        if (texelCount * texelBlockSize < 1) {
          uVar12 = uVar13;
        }
        for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
          dVar10 = deRandom_getUint32(&rng->m_rnd);
          buffer[uVar13] = (deUint8)dVar10;
        }
      }
    }
    else {
      uVar13 = 0;
      uVar12 = (ulong)(uint)(texelCount * texelBlockSize);
      if (texelCount * texelBlockSize < 1) {
        uVar12 = uVar13;
      }
      for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        dVar10 = deRandom_getUint32(&rng->m_rnd);
        buffer[uVar13] = (deUint8)dVar10;
      }
    }
  }
  return;
}

Assistant:

void genTexel (de::Random& rng, deUint32 glFormat, int texelBlockSize, const int texelCount, deUint8* buffer)
{
	if (isFloatFormat(glFormat))
	{
		const tcu::TextureFormat		format	= glu::mapGLInternalFormat(glFormat);
		const tcu::PixelBufferAccess	access	(format, texelCount, 1, 1, buffer);
		const tcu::TextureFormatInfo	info	= tcu::getTextureFormatInfo(format);

		for (int texelNdx = 0; texelNdx < texelCount; texelNdx++)
		{
			const float	red		= rng.getFloat(info.valueMin.x(), info.valueMax.x());
			const float green	= rng.getFloat(info.valueMin.y(), info.valueMax.y());
			const float blue	= rng.getFloat(info.valueMin.z(), info.valueMax.z());
			const float alpha	= rng.getFloat(info.valueMin.w(), info.valueMax.w());

			const Vec4	color	(red, green, blue, alpha);

			access.setPixel(color, texelNdx, 0, 0);
		}
	}
	else if (glu::isCompressedFormat(glFormat))
	{
		const tcu::CompressedTexFormat compressedFormat = glu::mapGLCompressedTexFormat(glFormat);

		if (tcu::isAstcFormat(compressedFormat))
		{
			const int		BLOCK_SIZE				= 16;
			const deUint8	blocks[][BLOCK_SIZE]	=
			{
				// \note All of the following blocks are valid in LDR mode.
				{ 252,	253,	255,	255,	255,	255,	255,	255,	8,		71,		90,		78,		22,		17,		26,		66,		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	220,	74,		139,	235,	249,	6,		145,	125		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	223,	251,	28,		206,	54,		251,	160,	174		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	39,		4,		153,	219,	180,	61,		51,		37		},
				{ 67,	2,		0,		254,	1,		0,		64,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	0,		170,	84,		255,	65,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	2,		129,	38,		51,		229,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	193,	56,		213,	144,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		}
			};

			DE_ASSERT(texelBlockSize == BLOCK_SIZE);

			for (int i = 0; i < texelCount; i++)
			{
				const int blockNdx = rng.getInt(0, DE_LENGTH_OF_ARRAY(blocks)-1);

				deMemcpy(buffer + i * BLOCK_SIZE,  blocks[blockNdx], BLOCK_SIZE);
			}
		}
		else
		{
			for (int i = 0; i < texelBlockSize * texelCount; i++)
			{
				const deUint8 val = rng.getUint8();

				buffer[i] = val;
			}
		}
	}
	else
	{
		for (int i = 0; i < texelBlockSize * texelCount; i++)
		{
			const deUint8 val = rng.getUint8();

			buffer[i] = val;
		}
	}
}